

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

termline * newtermline(Terminal *term,wchar_t cols,_Bool bce)

{
  undefined8 *puVar1;
  _Bool *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  termline *ptVar6;
  termchar *ptVar7;
  ulong uVar8;
  undefined7 in_register_00000011;
  long lVar9;
  uint uVar10;
  
  lVar9 = 0;
  ptVar6 = (termline *)safemalloc(1,0x28,0);
  ptVar7 = (termchar *)safemalloc((long)cols,0x20,0);
  uVar8 = 0;
  if (L'\0' < cols) {
    uVar8 = (ulong)(uint)cols;
  }
  ptVar6->chars = ptVar7;
  uVar10 = (int)CONCAT71(in_register_00000011,bce) << 5;
  for (; uVar8 * 0x20 != lVar9; lVar9 = lVar9 + 0x20) {
    ptVar7 = ptVar6->chars;
    uVar3 = *(undefined8 *)((long)&(term->basic_erase_char).chr + (ulong)uVar10);
    uVar4 = *(undefined8 *)((long)&(term->basic_erase_char).attr + (ulong)uVar10);
    uVar5 = *(undefined8 *)((long)&(term->basic_erase_char).cc_next + (ulong)uVar10);
    p_Var2 = &(ptVar7->truecolour).fg.enabled + lVar9;
    *(undefined8 *)p_Var2 =
         *(undefined8 *)(&(term->basic_erase_char).truecolour.fg.enabled + uVar10);
    *(undefined8 *)(p_Var2 + 8) = uVar5;
    puVar1 = (undefined8 *)((long)&ptVar7->chr + lVar9);
    *puVar1 = uVar3;
    puVar1[1] = uVar4;
  }
  ptVar6->size = cols;
  ptVar6->cols = cols;
  ptVar6->lattr = 0;
  ptVar6->trusted = false;
  ptVar6->temporary = false;
  ptVar6->cc_free = L'\0';
  return ptVar6;
}

Assistant:

static termline *newtermline(Terminal *term, int cols, bool bce)
{
    termline *line;
    int j;

    line = snew(termline);
    line->chars = snewn(cols, termchar);
    for (j = 0; j < cols; j++)
        line->chars[j] = (bce ? term->erase_char : term->basic_erase_char);
    line->cols = line->size = cols;
    line->lattr = LATTR_NORM;
    line->trusted = false;
    line->temporary = false;
    line->cc_free = 0;

    return line;
}